

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O0

void MergeUVRow_C(uint8_t *src_u,uint8_t *src_v,uint8_t *dst_uv,int width)

{
  int x;
  int width_local;
  uint8_t *dst_uv_local;
  uint8_t *src_v_local;
  uint8_t *src_u_local;
  
  dst_uv_local = dst_uv;
  for (x = 0; x < width + -1; x = x + 2) {
    *dst_uv_local = src_u[x];
    dst_uv_local[1] = src_v[x];
    dst_uv_local[2] = src_u[x + 1];
    dst_uv_local[3] = src_v[x + 1];
    dst_uv_local = dst_uv_local + 4;
  }
  if ((width & 1U) != 0) {
    *dst_uv_local = src_u[width + -1];
    dst_uv_local[1] = src_v[width + -1];
  }
  return;
}

Assistant:

void MergeUVRow_C(const uint8_t* src_u,
                  const uint8_t* src_v,
                  uint8_t* dst_uv,
                  int width) {
  int x;
  for (x = 0; x < width - 1; x += 2) {
    dst_uv[0] = src_u[x];
    dst_uv[1] = src_v[x];
    dst_uv[2] = src_u[x + 1];
    dst_uv[3] = src_v[x + 1];
    dst_uv += 4;
  }
  if (width & 1) {
    dst_uv[0] = src_u[width - 1];
    dst_uv[1] = src_v[width - 1];
  }
}